

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall tinyusdz::crate::CrateReader::ReadTimeSamples(CrateReader *this,TimeSamples *d)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  StreamReader *pSVar2;
  uint uVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  long lVar10;
  long *plVar11;
  char *pcVar12;
  uint __len;
  int64_t offset;
  ValueRep rep;
  vector<double,_std::allocator<double>_> times;
  uint64_t num_values;
  ValueRep times_rep;
  ostringstream ss_e;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_270;
  long *local_260;
  ulong local_258;
  storage_union local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  string *local_230;
  undefined1 local_228 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  long local_1f8;
  long *local_1e8 [2];
  long local_1d8 [2];
  ValueRep local_1c8;
  storage_union local_1c0;
  undefined8 *local_1b0;
  optional<std::vector<double,_std::allocator<double>_>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_258 = 0;
  bVar4 = StreamReader::read8(this->_sr,(int64_t *)&local_258);
  if (!bVar4) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTimeSamples",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x333);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar12 = "Failed to read the offset for value in Dictionary.";
    lVar10 = 0x32;
LAB_001bc300:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar12,lVar10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
LAB_001bc31c:
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,local_280._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != &aStack_270) {
      operator_delete((void *)local_280._0_8_,aStack_270._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base(local_138);
    return false;
  }
  pSVar2 = this->_sr;
  uVar6 = (local_258 + pSVar2->idx_) - 8;
  if (((long)uVar6 < 0) || (pSVar2->length_ < uVar6)) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTimeSamples",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x33d);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    uVar6 = -local_258;
    if (0 < (long)local_258) {
      uVar6 = local_258;
    }
    __len = 1;
    if (9 < uVar6) {
      uVar7 = uVar6;
      uVar3 = 4;
      do {
        __len = uVar3;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_001bc6bb;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_001bc6bb;
        }
        if (uVar7 < 10000) goto LAB_001bc6bb;
        bVar4 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar3 = __len + 4;
      } while (bVar4);
      __len = __len + 1;
    }
LAB_001bc6bb:
    lVar10 = (long)local_258 >> 0x3f;
    local_250.dynamic = &local_240;
    ::std::__cxx11::string::_M_construct
              ((ulong)&local_250,(char)__len - (char)((long)local_258 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)(local_250._0_8_ - lVar10),__len,uVar6)
    ;
    plVar11 = (long *)::std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x4069ea);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar8) {
      aStack_270._M_allocated_capacity = paVar8->_M_allocated_capacity;
      aStack_270._8_8_ = plVar11[3];
      local_280._0_8_ = &aStack_270;
    }
    else {
      aStack_270._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_280._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar11;
    }
    local_280._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar11 + 1);
    *plVar11 = (long)paVar8;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_280._0_8_,local_280._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != &aStack_270) {
      operator_delete((void *)local_280._0_8_,aStack_270._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.dynamic != &local_240) {
      operator_delete(local_250.dynamic,local_240._M_allocated_capacity + 1);
    }
    goto LAB_001bc31c;
  }
  pSVar2->idx_ = uVar6;
  local_1c8.data = 0;
  bVar4 = ReadValueRep(this,&local_1c8);
  if (!bVar4) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTimeSamples",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x344);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar12 = "Failed to read ValueRep for TimeSample\' `times` element.";
    lVar10 = 0x38;
    goto LAB_001bc300;
  }
  plVar11 = (long *)this->_sr->idx_;
  local_1b0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_1c0.dynamic = (void *)0x0;
  bVar4 = UnpackValueRep(this,&local_1c8,(CrateValue *)&local_1c0);
  if (!bVar4) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTimeSamples",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x357);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failed to unpack value of TimeSample\'s `times` element.",0x37)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,local_280._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != &aStack_270) {
      operator_delete((void *)local_280._0_8_,aStack_270._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base(local_138);
    bVar4 = false;
    goto LAB_001bcea8;
  }
  local_208._M_allocated_capacity = 0;
  local_208._8_8_ = (void *)0x0;
  local_1f8 = 0;
  tinyusdz::value::Value::get_value<std::vector<double,std::allocator<double>>>
            (local_1a8,(Value *)&local_1c0,false);
  if (local_1a8[0].has_value_ == true) {
    local_280._8_8_ = local_1a8[0].contained.data.__align;
    aStack_270._M_allocated_capacity = local_1a8[0].contained._8_8_;
    aStack_270._8_8_ = local_1a8[0].contained._16_8_;
    local_280[0] = 1;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&local_208,
               (vector<double,_std::allocator<double>_> *)(local_280 + 8));
  }
  else {
    local_280[0] = local_1a8[0].has_value_;
    local_260 = plVar11;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTimeSamples",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x362);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    local_1e8[0] = local_1d8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,
               "`times` in TimeSamples must be type `double[]`, but got type `{}`","");
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_228 + 0x10)
    ;
    pbVar9 = pbVar1;
    if (local_1b0 == (undefined8 *)0x0) {
      local_228._16_4_ = 0x64696f76;
      local_228._8_8_ = 4;
      local_228._20_4_ = local_228._20_4_ & 0xffffff00;
      local_228._0_8_ = pbVar1;
    }
    else {
      (*(code *)local_1b0[2])((string *)local_228);
    }
    fmt::format<std::__cxx11::string>
              ((string *)&local_250,(fmt *)local_1e8,(string *)local_228,pbVar9);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_250.dynamic,local_250._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.dynamic != &local_240) {
      operator_delete(local_250.dynamic,local_240._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._0_8_ !=
        pbVar1) {
      operator_delete((void *)local_228._0_8_,CONCAT44(local_228._20_4_,local_228._16_4_) + 1);
    }
    plVar11 = local_260;
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0],local_1d8[0] + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_250.dynamic);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.dynamic != &local_240) {
      operator_delete(local_250.dynamic,local_240._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base(local_138);
  }
  if ((local_280[0] == '\x01') &&
     ((anon_struct_8_0_00000001_for___align)local_280._8_8_ !=
      (anon_struct_8_0_00000001_for___align)0x0)) {
    operator_delete((void *)local_280._8_8_,aStack_270._8_8_ - local_280._8_8_);
  }
  if (local_1a8[0].has_value_ == false) {
LAB_001bce89:
    bVar4 = false;
  }
  else {
    pSVar2 = this->_sr;
    if ((long *)pSVar2->length_ < plVar11) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ReadTimeSamples",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x36b);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar12 = "Failed to seek to TimeSamples values.";
      lVar10 = 0x25;
LAB_001bce07:
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar12,lVar10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,local_280._0_8_);
LAB_001bce51:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._0_8_ != &aStack_270) {
LAB_001bce5b:
        operator_delete((void *)local_280._0_8_,aStack_270._M_allocated_capacity + 1);
      }
LAB_001bce68:
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      ::std::ios_base::~ios_base(local_138);
      goto LAB_001bce89;
    }
    pSVar2->idx_ = (uint64_t)plVar11;
    bVar4 = StreamReader::read8(pSVar2,(int64_t *)&local_258);
    if (!bVar4) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ReadTimeSamples",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x371);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar12 = "Failed to read the offset for value in TimeSamples.";
      lVar10 = 0x33;
      goto LAB_001bce07;
    }
    pSVar2 = this->_sr;
    uVar6 = (local_258 + pSVar2->idx_) - 8;
    if (((long)uVar6 < 0) || (pSVar2->length_ < uVar6)) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ReadTimeSamples",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x37a);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      ::std::__cxx11::to_string((string *)&local_250,local_258);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_280,"Failed to seek to TimeSample values. Invalid offset value: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_250);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_280._0_8_,local_280._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._0_8_ != &aStack_270) {
        operator_delete((void *)local_280._0_8_,aStack_270._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250.dynamic != &local_240) {
        operator_delete(local_250.dynamic,local_240._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,local_280._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._0_8_ != &aStack_270) goto LAB_001bce5b;
      goto LAB_001bce68;
    }
    pSVar2->idx_ = uVar6;
    local_1e8[0] = (long *)0x0;
    bVar4 = StreamReader::read8(pSVar2,(uint64_t *)local_1e8);
    if (!bVar4) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ReadTimeSamples",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x37f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar12 = "Failed to read the number of values from TimeSamples.";
      lVar10 = 0x35;
      goto LAB_001bce07;
    }
    if ((long *)((long)(local_208._8_8_ - local_208._0_8_) >> 3) != local_1e8[0]) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ReadTimeSamples",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x386);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar12 = "# of `times` elements and # of values in Crate differs.";
      lVar10 = 0x37;
      goto LAB_001bce07;
    }
    if (local_208._8_8_ == local_208._M_allocated_capacity) {
      lVar10 = 0;
    }
    else {
      local_230 = &this->_err;
      local_260 = (long *)0x0;
      do {
        bVar4 = ReadValueRep(this,(ValueRep *)local_228);
        if (!bVar4) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadTimeSamples",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x38d);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Failed to read ValueRep for TimeSample\' value element.",
                     0x36);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)local_230,local_280._0_8_);
          goto LAB_001bce51;
        }
        uVar6 = this->_sr->idx_;
        local_240._M_allocated_capacity =
             (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_250.dynamic =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        bVar4 = UnpackValueRep(this,(ValueRep *)local_228,(CrateValue *)&local_250);
        if (bVar4) {
          tinyusdz::value::TimeSamples::add_sample
                    (d,*(double *)(local_208._M_allocated_capacity + (long)local_260 * 8),
                     (Value *)&local_250);
          if (uVar6 <= this->_sr->length_) {
            this->_sr->idx_ = uVar6;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadTimeSamples",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x397);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Failed to unpack value of TimeSample\'s value element.",
                     0x35);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)local_230,local_280._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._0_8_ != &aStack_270) {
            operator_delete((void *)local_280._0_8_,aStack_270._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
        }
        if ((undefined8 *)local_240._M_allocated_capacity != (undefined8 *)0x0) {
          (**(code **)(local_240._M_allocated_capacity + 0x20))(&local_250);
        }
        if (!bVar4) goto LAB_001bce89;
        local_260 = (long *)((long)local_260 + 1);
      } while (local_260 < local_1e8[0]);
      lVar10 = (long)local_1e8[0] << 3;
    }
    pSVar2 = this->_sr;
    if ((long *)pSVar2->length_ < plVar11) {
      plVar11 = (long *)pSVar2->idx_;
    }
    else {
      pSVar2->idx_ = (uint64_t)plVar11;
    }
    plVar11 = (long *)((long)plVar11 + lVar10);
    if ((long *)pSVar2->length_ < plVar11 || (long)plVar11 < 0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ReadTimeSamples",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x3a5);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar12 = "Failed to seek over TimeSamples\'s values.";
      lVar10 = 0x29;
      goto LAB_001bce07;
    }
    pSVar2->idx_ = (uint64_t)plVar11;
    bVar4 = true;
  }
  if ((void *)local_208._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_208._M_allocated_capacity,local_1f8 - local_208._0_8_);
  }
LAB_001bcea8:
  if (local_1b0 == (undefined8 *)0x0) {
    return bVar4;
  }
  (*(code *)local_1b0[4])(&local_1c0);
  return bVar4;
}

Assistant:

bool CrateReader::ReadTimeSamples(value::TimeSamples *d) {

  // Layout
  //
  // - `times`(double[])
  // - NumValueReps(int64)
  // - ArrayOfValueRep
  //

  // TODO(syoyo): Deferred loading of TimeSamples?(See USD's implementation for details)

  DCOUT("ReadTimeSamples: offt before tell = " << _sr->tell());

  // 8byte for the offset for recursive value. See RecursiveRead() in
  // https://github.com/PixarAnimationStudios/USD/blob/release/pxr/usd/usd/crateFile.cpp for details.
  int64_t offset{0};
  if (!_sr->read8(&offset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the offset for value in Dictionary.");
    return false;
  }

  DCOUT("TimeSample times value offset = " << offset);
  DCOUT("TimeSample tell = " << _sr->tell());

  // -8 to compensate sizeof(offset)
  if (!_sr->seek_from_current(offset - 8)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek to TimeSample times. Invalid offset value: " +
            std::to_string(offset));
  }

  // TODO(syoyo): Deduplicate times?

  crate::ValueRep times_rep{0};
  if (!ReadValueRep(&times_rep)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read ValueRep for TimeSample' `times` element.");
  }

  // Save offset
  auto values_offset = _sr->tell();

  // TODO: Enable Check if  type `double[]`
#if 0
  if (times_rep.GetType() == crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE_VECTOR) {
    // ok
  } else if ((times_rep.GetType() == crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBOLE) && times_rep.IsArray()) {
    // ok
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("`times` value must be type `double[]`, but got type `{}`", times_rep.GetTypeName()));
  }
#endif

  crate::CrateValue times_value;
  if (!UnpackValueRep(times_rep, &times_value)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to unpack value of TimeSample's `times` element.");
  }

  // must be an array of double.
  DCOUT("TimeSample times:" << times_value.type_name());

  std::vector<double> times;
  if (auto pv = times_value.get_value<std::vector<double>>()) {
    times = pv.value();
    DCOUT("`times` = " << times);
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("`times` in TimeSamples must be type `double[]`, but got type `{}`", times_value.type_name()));
  }

  //
  // Parse values(elements) of TimeSamples.
  //

  // seek position will be changed in `_UnpackValueRep`, so revert it.
  if (!_sr->seek_set(values_offset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek to TimeSamples values.");
  }

  // 8byte for the offset for recursive value. See RecursiveRead() in
  // crateFile.cpp for details.
  if (!_sr->read8(&offset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the offset for value in TimeSamples.");
    return false;
  }

  DCOUT("TimeSample value offset = " << offset);
  DCOUT("TimeSample tell = " << _sr->tell());

  // -8 to compensate sizeof(offset)
  if (!_sr->seek_from_current(offset - 8)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek to TimeSample values. Invalid offset value: " + std::to_string(offset));
  }

  uint64_t num_values{0};
  if (!_sr->read8(&num_values)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of values from TimeSamples.");
    return false;
  }

  DCOUT("Number of values = " << num_values);

  if (times.size() != num_values) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "# of `times` elements and # of values in Crate differs.");
  }

  for (size_t i = 0; i < num_values; i++) {

    crate::ValueRep rep;
    if (!ReadValueRep(&rep)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read ValueRep for TimeSample' value element.");
    }

    auto next_vrep_loc = _sr->tell();

    ///
    /// Type check of the content of `value` will be done at ReconstructPrim() in usdc-reader.cc.
    ///
    crate::CrateValue value;
    if (!UnpackValueRep(rep, &value)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to unpack value of TimeSample's value element.");
    }

    d->add_sample(times[i], value.get_raw());

    // UnpackValueRep() will change StreamReader's read position.
    // Revert to next ValueRep location here.
    _sr->seek_set(next_vrep_loc);
  }

  // Move to next location.
  // sizeof(uint64) = sizeof(ValueRep)
  _sr->seek_set(values_offset);
  if (!_sr->seek_from_current(int64_t(sizeof(uint64_t) * num_values))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek over TimeSamples's values.");
  }


  return true;
}